

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O1

bool __thiscall cmCTestLaunch::ParseArguments(cmCTestLaunch *this,int argc,char **argv)

{
  string *psVar1;
  int iVar2;
  undefined4 uVar3;
  char *__s1;
  char *pcVar4;
  ulong uVar5;
  cmCTestLaunch *pcVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  char *local_38;
  
  if (argc < 2) {
    bVar10 = true;
    iVar2 = 0;
  }
  else {
    psVar1 = &this->OptionLanguage;
    uVar5 = 0;
    uVar3 = 0;
    uVar8 = 2;
    do {
      __s1 = argv[uVar8 - 1];
      iVar2 = strcmp(__s1,"--");
      if (iVar2 == 0) {
        uVar5 = uVar8 & 0xffffffff;
        goto switchD_0018c043_caseD_7;
      }
      iVar2 = strcmp(__s1,"--output");
      if (iVar2 == 0) {
        uVar3 = 1;
        goto switchD_0018c043_caseD_7;
      }
      iVar2 = strcmp(__s1,"--source");
      if (iVar2 == 0) {
        uVar3 = 2;
        goto switchD_0018c043_caseD_7;
      }
      iVar2 = strcmp(__s1,"--language");
      if (iVar2 == 0) {
        uVar3 = 3;
        goto switchD_0018c043_caseD_7;
      }
      iVar2 = strcmp(__s1,"--target-name");
      if (iVar2 == 0) {
        uVar3 = 4;
        goto switchD_0018c043_caseD_7;
      }
      iVar2 = strcmp(__s1,"--target-type");
      if (iVar2 == 0) {
        uVar3 = 5;
        goto switchD_0018c043_caseD_7;
      }
      iVar2 = strcmp(__s1,"--build-dir");
      if (iVar2 == 0) {
        uVar3 = 6;
        goto switchD_0018c043_caseD_7;
      }
      iVar2 = strcmp(__s1,"--filter-prefix");
      if (iVar2 == 0) {
        uVar3 = 8;
        goto switchD_0018c043_caseD_7;
      }
      switch(uVar3) {
      case 1:
        pcVar4 = (char *)(this->OptionOutput)._M_string_length;
        strlen(__s1);
        pcVar6 = this;
        break;
      case 2:
        pcVar4 = (char *)(this->OptionSource)._M_string_length;
        strlen(__s1);
        pcVar6 = (cmCTestLaunch *)&this->OptionSource;
        break;
      case 3:
        pcVar4 = (char *)(this->OptionLanguage)._M_string_length;
        strlen(__s1);
        uVar3 = 0;
        std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar4,(ulong)__s1);
        iVar2 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar2 == 0) {
          pcVar4 = (char *)(this->OptionLanguage)._M_string_length;
          __s1 = "C++";
          pcVar6 = (cmCTestLaunch *)psVar1;
          break;
        }
        goto switchD_0018c043_caseD_7;
      case 4:
        pcVar4 = (char *)(this->OptionTargetName)._M_string_length;
        strlen(__s1);
        pcVar6 = (cmCTestLaunch *)&this->OptionTargetName;
        break;
      case 5:
        pcVar4 = (char *)(this->OptionTargetType)._M_string_length;
        strlen(__s1);
        pcVar6 = (cmCTestLaunch *)&this->OptionTargetType;
        break;
      case 6:
        pcVar4 = (char *)(this->OptionBuildDir)._M_string_length;
        strlen(__s1);
        pcVar6 = (cmCTestLaunch *)&this->OptionBuildDir;
        break;
      default:
        goto switchD_0018c043_caseD_7;
      case 8:
        pcVar4 = (char *)(this->OptionFilterPrefix)._M_string_length;
        strlen(__s1);
        pcVar6 = (cmCTestLaunch *)&this->OptionFilterPrefix;
      }
      uVar3 = 0;
      std::__cxx11::string::_M_replace((ulong)pcVar6,0,pcVar4,(ulong)__s1);
switchD_0018c043_caseD_7:
      iVar2 = (int)uVar5;
      bVar10 = iVar2 == 0;
    } while ((bVar10) && (bVar9 = uVar8 < (uint)argc, uVar8 = uVar8 + 1, bVar9));
  }
  if (bVar10 == false) {
    this->RealArgC = argc - iVar2;
    this->RealArgV = argv + iVar2;
    if (argc - iVar2 != 0 && iVar2 <= argc) {
      lVar7 = 0;
      do {
        local_38 = this->RealArgV[lVar7];
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->RealArgs,&local_38);
        lVar7 = lVar7 + 1;
      } while (lVar7 < this->RealArgC);
    }
  }
  else {
    this->RealArgC = 0;
    this->RealArgV = (char **)0x0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"No launch/command separator (\'--\') found!\n",0x2a);
  }
  return (bool)(bVar10 ^ 1);
}

Assistant:

bool cmCTestLaunch::ParseArguments(int argc, const char* const* argv)
{
  // Launcher options occur first and are separated from the real
  // command line by a '--' option.
  enum Doing
  {
    DoingNone,
    DoingOutput,
    DoingSource,
    DoingLanguage,
    DoingTargetName,
    DoingTargetType,
    DoingBuildDir,
    DoingCount,
    DoingFilterPrefix
  };
  Doing doing = DoingNone;
  int arg0 = 0;
  for (int i = 1; !arg0 && i < argc; ++i) {
    const char* arg = argv[i];
    if (strcmp(arg, "--") == 0) {
      arg0 = i + 1;
    } else if (strcmp(arg, "--output") == 0) {
      doing = DoingOutput;
    } else if (strcmp(arg, "--source") == 0) {
      doing = DoingSource;
    } else if (strcmp(arg, "--language") == 0) {
      doing = DoingLanguage;
    } else if (strcmp(arg, "--target-name") == 0) {
      doing = DoingTargetName;
    } else if (strcmp(arg, "--target-type") == 0) {
      doing = DoingTargetType;
    } else if (strcmp(arg, "--build-dir") == 0) {
      doing = DoingBuildDir;
    } else if (strcmp(arg, "--filter-prefix") == 0) {
      doing = DoingFilterPrefix;
    } else if (doing == DoingOutput) {
      this->OptionOutput = arg;
      doing = DoingNone;
    } else if (doing == DoingSource) {
      this->OptionSource = arg;
      doing = DoingNone;
    } else if (doing == DoingLanguage) {
      this->OptionLanguage = arg;
      if (this->OptionLanguage == "CXX") {
        this->OptionLanguage = "C++";
      }
      doing = DoingNone;
    } else if (doing == DoingTargetName) {
      this->OptionTargetName = arg;
      doing = DoingNone;
    } else if (doing == DoingTargetType) {
      this->OptionTargetType = arg;
      doing = DoingNone;
    } else if (doing == DoingBuildDir) {
      this->OptionBuildDir = arg;
      doing = DoingNone;
    } else if (doing == DoingFilterPrefix) {
      this->OptionFilterPrefix = arg;
      doing = DoingNone;
    }
  }

  // Extract the real command line.
  if (arg0) {
    this->RealArgC = argc - arg0;
    this->RealArgV = argv + arg0;
    for (int i = 0; i < this->RealArgC; ++i) {
      this->HandleRealArg(this->RealArgV[i]);
    }
    return true;
  }
  this->RealArgC = 0;
  this->RealArgV = nullptr;
  std::cerr << "No launch/command separator ('--') found!\n";
  return false;
}